

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus_test.c
# Opt level: O2

void test_bus_recv_buf_option(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err nVar3;
  char *pcVar4;
  char *pcVar5;
  int local_3c;
  _Bool local_35;
  int v;
  _Bool b;
  nng_socket s;
  
  nVar1 = nng_bus0_open((nng_socket *)&v);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x14d,"%s: expected success, got %s (%d)","nng_bus0_open(&s)",pcVar4,nVar1
                        );
  if (iVar2 != 0) {
    nVar1 = nng_socket_set_int((nng_socket)v,"recv-buffer",1);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x14f,"%s: expected success, got %s (%d)",
                           "nng_socket_set_int(s, opt, 1)",pcVar4,nVar1);
    if (iVar2 != 0) {
      nVar3 = nng_socket_set_int((nng_socket)v,"recv-buffer",0);
      pcVar4 = nng_strerror(NNG_EINVAL);
      acutest_check_((uint)(nVar3 == NNG_EINVAL),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                     ,0x150,"%s fails with %s","nng_socket_set_int(s, opt, 0)",pcVar4,nVar1);
      pcVar4 = nng_strerror(NNG_EINVAL);
      pcVar5 = nng_strerror(nVar3);
      acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(s, opt, 0)",pcVar4,3,
                       pcVar5,(ulong)nVar3);
      nVar1 = nng_socket_set_int((nng_socket)v,"recv-buffer",-1);
      pcVar4 = nng_strerror(NNG_EINVAL);
      acutest_check_((uint)(nVar1 == NNG_EINVAL),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                     ,0x151,"%s fails with %s","nng_socket_set_int(s, opt, -1)",pcVar4);
      pcVar4 = nng_strerror(NNG_EINVAL);
      pcVar5 = nng_strerror(nVar1);
      acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(s, opt, -1)",pcVar4,3
                       ,pcVar5,(ulong)nVar1);
      nVar1 = nng_socket_set_int((nng_socket)v,"recv-buffer",1000000);
      pcVar4 = nng_strerror(NNG_EINVAL);
      acutest_check_((uint)(nVar1 == NNG_EINVAL),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                     ,0x152,"%s fails with %s","nng_socket_set_int(s, opt, 1000000)",pcVar4);
      pcVar4 = nng_strerror(NNG_EINVAL);
      pcVar5 = nng_strerror(nVar1);
      acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(s, opt, 1000000)",
                       pcVar4,3,pcVar5,(ulong)nVar1);
      nVar1 = nng_socket_set_int((nng_socket)v,"recv-buffer",3);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                             ,0x153,"%s: expected success, got %s (%d)",
                             "nng_socket_set_int(s, opt, 3)",pcVar4,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_get_int((nng_socket)v,"recv-buffer",&local_3c);
        pcVar4 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                               ,0x154,"%s: expected success, got %s (%d)",
                               "nng_socket_get_int(s, opt, &v)",pcVar4,nVar1);
        if (iVar2 != 0) {
          acutest_check_((uint)(local_3c == 3),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x155,"%s","v == 3");
          nVar3 = nng_socket_set_bool((nng_socket)v,"recv-buffer",true);
          pcVar4 = nng_strerror(NNG_EBADTYPE);
          acutest_check_((uint)(nVar3 == NNG_EBADTYPE),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x156,"%s fails with %s","nng_socket_set_bool(s, opt, true)",pcVar4,nVar1)
          ;
          pcVar4 = nng_strerror(NNG_EBADTYPE);
          pcVar5 = nng_strerror(nVar3);
          acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_bool(s, opt, true)",
                           pcVar4,0x1e,pcVar5,(ulong)nVar3);
          nVar1 = nng_socket_get_bool((nng_socket)v,"recv-buffer",&local_35);
          pcVar4 = nng_strerror(NNG_EBADTYPE);
          acutest_check_((uint)(nVar1 == NNG_EBADTYPE),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x157,"%s fails with %s","nng_socket_get_bool(s, opt, &b)",pcVar4);
          pcVar4 = nng_strerror(NNG_EBADTYPE);
          pcVar5 = nng_strerror(nVar1);
          acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_get_bool(s, opt, &b)",
                           pcVar4,0x1e,pcVar5,(ulong)nVar1);
          nVar1 = nng_socket_close((nng_socket)v);
          pcVar4 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                 ,0x159,"%s: expected success, got %s (%d)","nng_socket_close(s)",
                                 pcVar4,nVar1);
          if (iVar2 != 0) {
            return;
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_bus_recv_buf_option(void)
{
	nng_socket  s;
	int         v;
	bool        b;
	const char *opt = NNG_OPT_RECVBUF;

	NUTS_PASS(nng_bus0_open(&s));

	NUTS_PASS(nng_socket_set_int(s, opt, 1));
	NUTS_FAIL(nng_socket_set_int(s, opt, 0), NNG_EINVAL);
	NUTS_FAIL(nng_socket_set_int(s, opt, -1), NNG_EINVAL);
	NUTS_FAIL(nng_socket_set_int(s, opt, 1000000), NNG_EINVAL);
	NUTS_PASS(nng_socket_set_int(s, opt, 3));
	NUTS_PASS(nng_socket_get_int(s, opt, &v));
	NUTS_TRUE(v == 3);
	NUTS_FAIL(nng_socket_set_bool(s, opt, true), NNG_EBADTYPE);
	NUTS_FAIL(nng_socket_get_bool(s, opt, &b), NNG_EBADTYPE);

	NUTS_CLOSE(s);
}